

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

void __thiscall
pybind11::class_<Person,_std::shared_ptr<Person>_>::class_<>
          (class_<Person,_std::shared_ptr<Person>_> *this,handle scope,char *name)

{
  type_record record;
  type_record local_68;
  
  (this->super_generic_type).super_object.super_handle.m_ptr = (PyObject *)0x0;
  detail::type_record::type_record(&local_68);
  local_68.type = (type_info *)&Person::typeinfo;
  local_68.type_size = 0x30;
  local_68.instance_size = 0x38;
  local_68.init_holder = init_holder;
  local_68.dealloc = dealloc;
  local_68.scope.m_ptr = scope.m_ptr;
  local_68.name = name;
  detail::generic_type::initialize(&this->super_generic_type,&local_68);
  object::~object(&local_68.bases.super_object);
  return;
}

Assistant:

class_(handle scope, const char *name, const Extra &... extra) {
        detail::type_record record;
        record.scope = scope;
        record.name = name;
        record.type = &typeid(type);
        record.type_size = sizeof(detail::conditional_t<has_alias, type_alias, type>);
        record.instance_size = sizeof(instance_type);
        record.init_holder = init_holder;
        record.dealloc = dealloc;

        /* Register base classes specified via template arguments to class_, if any */
        bool unused[] = { (add_base<options>(record), false)..., false };
        (void) unused;

        /* Process optional arguments, if any */
        detail::process_attributes<Extra...>::init(extra..., &record);

        detail::generic_type::initialize(&record);

        if (has_alias) {
            auto &instances = pybind11::detail::get_internals().registered_types_cpp;
            instances[std::type_index(typeid(type_alias))] = instances[std::type_index(typeid(type))];
        }
    }